

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcdctmgr.c
# Opt level: O0

void forward_DCT_float(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY sample_data,
                      JBLOCKROW coef_blocks,JDIMENSION start_row,JDIMENSION start_col,
                      JDIMENSION num_blocks)

{
  forward_DCT_ptr p_Var1;
  ulong uVar2;
  JBLOCKROW paJVar3;
  JDIMENSION in_stack_fffffffffffffe98;
  JCOEFPTR output_ptr;
  int i;
  float temp;
  JDIMENSION bi;
  float workspace [64];
  float *divisors;
  float_DCT_method_ptr do_dct;
  my_fdct_ptr fdct;
  JDIMENSION start_col_local;
  JDIMENSION start_row_local;
  JBLOCKROW coef_blocks_local;
  JSAMPARRAY sample_data_local;
  jpeg_component_info *compptr_local;
  j_compress_ptr cinfo_local;
  
  p_Var1 = cinfo->fdct[2].forward_DCT[(long)compptr->component_index + 2];
  workspace._248_8_ = cinfo->fdct[3].forward_DCT[(long)compptr->quant_tbl_no + 1];
  uVar2 = (ulong)start_row;
  paJVar3 = (JBLOCKROW)(uVar2 * 8);
  fdct._0_4_ = start_col;
  for (i = 0; (uint)i < num_blocks; i = i + 1) {
    (*p_Var1)((j_compress_ptr)&temp,(jpeg_component_info *)(sample_data + uVar2),
              (JSAMPARRAY)(ulong)(JDIMENSION)fdct,paJVar3,start_row,start_col,
              in_stack_fffffffffffffe98);
    paJVar3 = (JBLOCKROW)((ulong)(uint)i * 0x80);
    for (output_ptr._4_4_ = 0; output_ptr._4_4_ < 0x40; output_ptr._4_4_ = output_ptr._4_4_ + 1) {
      paJVar3 = (JBLOCKROW)(long)output_ptr._4_4_;
      coef_blocks[(uint)i][(long)paJVar3] =
           (short)(int)((&temp)[output_ptr._4_4_] *
                        *(float *)(workspace._248_8_ + (long)output_ptr._4_4_ * 4) + 16384.5) +
           -0x4000;
    }
    fdct._0_4_ = compptr->DCT_h_scaled_size + (JDIMENSION)fdct;
  }
  return;
}

Assistant:

METHODDEF(void)
forward_DCT_float (j_compress_ptr cinfo, jpeg_component_info * compptr,
		   JSAMPARRAY sample_data, JBLOCKROW coef_blocks,
		   JDIMENSION start_row, JDIMENSION start_col,
		   JDIMENSION num_blocks)
/* This version is used for floating-point DCT implementations. */
{
  /* This routine is heavily used, so it's worth coding it tightly. */
  my_fdct_ptr fdct = (my_fdct_ptr) cinfo->fdct;
  float_DCT_method_ptr do_dct = fdct->do_float_dct[compptr->component_index];
  FAST_FLOAT * divisors = fdct->float_divisors[compptr->quant_tbl_no];
  FAST_FLOAT workspace[DCTSIZE2]; /* work area for FDCT subroutine */
  JDIMENSION bi;

  sample_data += start_row;	/* fold in the vertical offset once */

  for (bi = 0; bi < num_blocks; bi++, start_col += compptr->DCT_h_scaled_size) {
    /* Perform the DCT */
    (*do_dct) (workspace, sample_data, start_col);

    /* Quantize/descale the coefficients, and store into coef_blocks[] */
    { register FAST_FLOAT temp;
      register int i;
      register JCOEFPTR output_ptr = coef_blocks[bi];

      for (i = 0; i < DCTSIZE2; i++) {
	/* Apply the quantization and scaling factor */
	temp = workspace[i] * divisors[i];
	/* Round to nearest integer.
	 * Since C does not specify the direction of rounding for negative
	 * quotients, we have to force the dividend positive for portability.
	 * The maximum coefficient size is +-16K (for 12-bit data), so this
	 * code should work for either 16-bit or 32-bit ints.
	 */
	output_ptr[i] = (JCOEF) ((int) (temp + (FAST_FLOAT) 16384.5) - 16384);
      }
    }
  }
}